

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O1

bool __thiscall DyndepParser::ParseEdge(DyndepParser *this,string *err)

{
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  long *plVar5;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 extraout_var_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uint uVar7;
  ulong uVar8;
  EvalString *this_00;
  pointer this_01;
  _Base_ptr *this_02;
  Lexer *this_03;
  ulong unaff_R14;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> pVar9;
  string path;
  EvalString out;
  string rule_name;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  EvalString val;
  Node *n_1;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  void *pvStack_118;
  undefined8 local_110;
  long lStack_108;
  _Base_ptr local_f8;
  Lexer *local_f0;
  undefined1 local_e8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  pointer local_c8;
  pointer ppNStack_c0;
  pointer local_b8;
  pointer ppNStack_b0;
  DyndepParser *local_a0;
  EvalString local_98;
  ulong local_80;
  vector<EvalString,_std::allocator<EvalString>_> local_78;
  EvalString local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  Node *local_38;
  
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_03 = &(this->super_Parser).lexer_;
  bVar2 = Lexer::ReadEvalString(this_03,&local_98,true,err);
  if (bVar2) {
    if (local_98.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_98.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_e8 = (undefined1  [8])&local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"expected path","");
      bVar2 = Lexer::Error(this_03,(string *)local_e8,err);
      unaff_R14 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
      if (local_e8 != (undefined1  [8])&local_d8) {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
      }
      uVar7 = 0;
      local_f8 = (_Base_ptr)0x0;
    }
    else {
      EvalString::Evaluate_abi_cxx11_(&local_158,&local_98,&(this->env_).super_Env);
      if ((char *)local_158._M_string_length == (char *)0x0) {
        local_e8 = (undefined1  [8])&local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"empty path","");
        bVar2 = Lexer::Error(this_03,(string *)local_e8,err);
        unaff_R14 = CONCAT71(extraout_var_00,bVar2) & 0xffffffff;
        if (local_e8 != (undefined1  [8])&local_d8) {
          operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
        }
        uVar7 = 0;
        local_f8 = (_Base_ptr)0x0;
      }
      else {
        CanonicalizePath(&local_158,(uint64_t *)&local_78);
        path_00.len_ = local_158._M_string_length;
        path_00.str_ = local_158._M_dataplus._M_p;
        pNVar4 = State::LookupNode((this->super_Parser).state_,path_00);
        if ((pNVar4 == (Node *)0x0) ||
           (local_e8 = (undefined1  [8])pNVar4->in_edge_, local_e8 == (undefined1  [8])0x0)) {
          std::operator+(&local_138,"no build statement exists for \'",&local_158);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar6) {
            local_d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_d8._8_8_ = plVar5[3];
            local_e8 = (undefined1  [8])&local_d8;
          }
          else {
            local_d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_e8 = (undefined1  [8])*plVar5;
          }
          paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)plVar5[1];
          *plVar5 = (long)paVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          bVar2 = Lexer::Error(this_03,(string *)local_e8,err);
          unaff_R14 = CONCAT71(extraout_var_01,bVar2) & 0xffffffff;
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
              &local_138.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                     local_138._M_dataplus._M_p._0_2_),
                            local_138.field_2._M_allocated_capacity + 1);
          }
          uVar7 = 0;
        }
        else {
          local_138._M_dataplus._M_p._0_2_ = 0;
          paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((ulong)paStack_e0 & 0xffffffffffff0000);
          local_d8._M_allocated_capacity = 0;
          local_d8._8_8_ = (pointer)0x0;
          local_c8 = (pointer)0x0;
          ppNStack_c0 = (pointer)0x0;
          local_138._M_string_length = 0;
          local_138.field_2._M_allocated_capacity = 0;
          local_138.field_2._8_8_ = 0;
          local_b8 = (pointer)0x0;
          ppNStack_b0 = (pointer)0x0;
          lStack_108 = 0;
          pvStack_118 = (void *)0x0;
          local_110 = 0;
          pVar9 = std::
                  _Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
                  ::_M_insert_unique<std::pair<Edge*const,Dyndeps>>
                            ((_Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
                              *)this->dyndep_file_,(pair<Edge_*const,_Dyndeps> *)local_e8);
          local_f8 = (_Base_ptr)pVar9.first._M_node;
          uVar7 = pVar9._8_4_;
          if (ppNStack_c0 != (pointer)0x0) {
            operator_delete(ppNStack_c0,(long)ppNStack_b0 - (long)ppNStack_c0);
          }
          if ((pointer)local_d8._M_allocated_capacity != (pointer)0x0) {
            operator_delete((void *)local_d8._M_allocated_capacity,(long)local_c8 - local_d8._0_8_);
          }
          if (pvStack_118 != (void *)0x0) {
            operator_delete(pvStack_118,lStack_108 - (long)pvStack_118);
          }
          if ((void *)local_138._M_string_length != (void *)0x0) {
            operator_delete((void *)local_138._M_string_length,
                            local_138.field_2._8_8_ - local_138._M_string_length);
          }
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_f8 = (_Base_ptr)&local_f8[1]._M_parent;
            goto LAB_0010f74b;
          }
          std::operator+(&local_138,"multiple statements for \'",&local_158);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar6) {
            local_d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_d8._8_8_ = plVar5[3];
            local_e8 = (undefined1  [8])&local_d8;
          }
          else {
            local_d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_e8 = (undefined1  [8])*plVar5;
          }
          paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)plVar5[1];
          *plVar5 = (long)paVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          bVar2 = Lexer::Error(this_03,(string *)local_e8,err);
          unaff_R14 = CONCAT71(extraout_var_04,bVar2) & 0xffffffff;
          if (local_e8 != (undefined1  [8])&local_d8) {
            operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
              &local_138.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                     local_138._M_dataplus._M_p._0_2_),
                            local_138.field_2._M_allocated_capacity + 1);
          }
        }
        local_f8 = (_Base_ptr)0x0;
      }
LAB_0010f74b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    uVar7 = 0;
    local_f8 = (_Base_ptr)0x0;
    unaff_R14 = 0;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_98.parsed_);
  if ((uVar7 & 1) == 0) goto LAB_0010f9e2;
  local_138._M_dataplus._M_p._0_2_ = 0;
  local_138._M_dataplus._M_p._2_6_ = 0;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity = 0;
  bVar2 = Lexer::ReadEvalString(this_03,(EvalString *)&local_138,true,err);
  if (bVar2) {
    if (CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) ==
        local_138._M_string_length) {
      bVar2 = true;
    }
    else {
      local_e8 = (undefined1  [8])&local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"explicit outputs not supported","");
      bVar2 = Lexer::Error(this_03,(string *)local_e8,err);
      unaff_R14 = CONCAT71(extraout_var_02,bVar2) & 0xffffffff;
      if (local_e8 != (undefined1  [8])&local_d8) {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    unaff_R14 = 0;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_138);
  if (!bVar2) goto LAB_0010f9e2;
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Lexer::PeekToken(this_03,PIPE);
  if (bVar2) {
    local_f0 = this_03;
    local_a0 = this;
    do {
      uVar8 = unaff_R14 & 0xffffffff;
      local_e8 = (undefined1  [8])0x0;
      paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      local_d8._M_allocated_capacity = 0;
      bVar2 = Lexer::ReadEvalString(local_f0,(EvalString *)local_e8,true,err);
      iVar3 = 1;
      unaff_R14 = CONCAT71((int7)((ulong)err >> 8),err != (string *)0x0) & 0xffffffff;
      if (bVar2) {
        unaff_R14 = uVar8;
        if (local_e8 == (undefined1  [8])paStack_e0) {
          iVar3 = 2;
        }
        else {
          iVar3 = 0;
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    ((vector<EvalString,_std::allocator<EvalString>_> *)&local_98,
                     (EvalString *)local_e8);
        }
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                 *)local_e8);
    } while (iVar3 == 0);
    this_03 = local_f0;
    this = local_a0;
    if (iVar3 == 2) goto LAB_0010f903;
  }
  else {
LAB_0010f903:
    bVar2 = Parser::ExpectToken(&this->super_Parser,COLON,err);
    if (bVar2) {
      local_e8 = (undefined1  [8])&local_d8;
      paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      local_d8._M_allocated_capacity = local_d8._M_allocated_capacity & 0xffffffffffffff00;
      bVar2 = Lexer::ReadIdent(this_03,(string *)local_e8);
      if ((bVar2) && (iVar3 = std::__cxx11::string::compare(local_e8), iVar3 == 0)) {
        local_158._M_dataplus._M_p = (pointer)0x0;
        local_158._M_string_length = 0;
        local_158.field_2._M_allocated_capacity = 0;
        bVar2 = Lexer::ReadEvalString(this_03,(EvalString *)&local_158,true,err);
        if (bVar2) {
          if (local_158._M_dataplus._M_p == (pointer)local_158._M_string_length) {
            bVar2 = true;
          }
          else {
            paVar6 = &local_138.field_2;
            local_138._M_dataplus._M_p._0_2_ = SUB82(paVar6,0);
            local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar6 >> 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"explicit inputs not supported","");
            bVar2 = Lexer::Error(this_03,&local_138,err);
            unaff_R14 = CONCAT71(extraout_var_03,bVar2) & 0xffffffff;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
                paVar6) {
              operator_delete((undefined1 *)
                              CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                       local_138._M_dataplus._M_p._0_2_),
                              local_138.field_2._M_allocated_capacity + 1);
            }
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
          unaff_R14 = 0;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&local_158);
        if (bVar2) {
          local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
          super__Vector_impl_data._M_start = (EvalString *)0x0;
          local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
          super__Vector_impl_data._M_finish = (EvalString *)0x0;
          local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar2 = Lexer::PeekToken(this_03,PIPE);
          if (bVar2) {
            local_f0 = this_03;
            local_a0 = this;
            do {
              uVar8 = unaff_R14 & 0xffffffff;
              local_138._M_dataplus._M_p._0_2_ = 0;
              local_138._M_dataplus._M_p._2_6_ = 0;
              local_138._M_string_length = 0;
              local_138.field_2._M_allocated_capacity = 0;
              bVar2 = Lexer::ReadEvalString(local_f0,(EvalString *)&local_138,true,err);
              iVar3 = 1;
              unaff_R14 = CONCAT71((int7)((ulong)this_03 >> 8),err != (string *)0x0) & 0xffffffff;
              if (bVar2) {
                unaff_R14 = uVar8;
                if (CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) ==
                    local_138._M_string_length) {
                  iVar3 = 4;
                }
                else {
                  iVar3 = 0;
                  std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                            (&local_78,(value_type *)&local_138);
                }
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)&local_138);
            } while (iVar3 == 0);
            this_03 = local_f0;
            this = local_a0;
            if (iVar3 == 4) goto LAB_0010fc33;
          }
          else {
LAB_0010fc33:
            bVar2 = Lexer::PeekToken(this_03,PIPE2);
            if (bVar2) {
              paVar6 = &local_138.field_2;
              local_138._M_dataplus._M_p._0_2_ = SUB82(paVar6,0);
              local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar6 >> 0x10);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"order-only inputs not supported","");
              bVar2 = Lexer::Error(this_03,&local_138,err);
              unaff_R14 = (ulong)bVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
                  paVar6) {
                operator_delete((undefined1 *)
                                CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                         local_138._M_dataplus._M_p._0_2_),
                                local_138.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              bVar2 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
              if (bVar2) {
                bVar2 = Lexer::PeekToken(this_03,INDENT);
                if (bVar2) {
                  local_138._M_dataplus._M_p._0_2_ = SUB82(&local_138.field_2,0);
                  local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)&local_138.field_2 >> 0x10)
                  ;
                  local_138._M_string_length = 0;
                  local_138.field_2._M_allocated_capacity =
                       local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_58.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_58.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_58.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  bVar2 = ParseLet(this,&local_138,&local_58,err);
                  if (bVar2) {
                    iVar3 = std::__cxx11::string::compare((char *)&local_138);
                    if (iVar3 == 0) {
                      EvalString::Evaluate_abi_cxx11_(&local_158,&local_58,&(this->env_).super_Env);
                      *(bool *)((long)&((Env *)&local_f8->_M_color)->_vptr_Env + 1) =
                           (char *)local_158._M_string_length != (char *)0x0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                        operator_delete(local_158._M_dataplus._M_p,
                                        local_158.field_2._M_allocated_capacity + 1);
                      }
                      bVar2 = true;
                    }
                    else {
                      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_158,"binding is not \'restat\'","");
                      bVar2 = Lexer::Error(this_03,&local_158,err);
                      unaff_R14 = CONCAT71(extraout_var_05,bVar2) & 0xffffffff;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                        operator_delete(local_158._M_dataplus._M_p,
                                        local_158.field_2._M_allocated_capacity + 1);
                      }
                      bVar2 = false;
                    }
                  }
                  else {
                    bVar2 = false;
                    unaff_R14 = 0;
                  }
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ::~vector(&local_58.parsed_);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_)
                      != &local_138.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                             local_138._M_dataplus._M_p._0_2_),
                                    local_138.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar2) goto LAB_001100cc;
                }
                local_40 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_f8->_M_parent;
                local_80 = unaff_R14;
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          ((vector<Node_*,_std::allocator<Node_*>_> *)local_40,
                           ((long)local_78.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
                local_f0 = (Lexer *)CONCAT71(local_f0._1_7_,
                                             local_78.
                                             super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                             ._M_impl.super__Vector_impl_data._M_start ==
                                             local_78.
                                             super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
                if (local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_a0 = (DyndepParser *)&this->env_;
                  this_00 = local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  do {
                    EvalString::Evaluate_abi_cxx11_(&local_138,this_00,(Env *)local_a0);
                    sVar1 = local_138._M_string_length;
                    if (local_138._M_string_length == 0) {
                      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_158,"empty path","");
                      bVar2 = Lexer::Error(this_03,&local_158,err);
                      local_80 = CONCAT71(extraout_var_06,bVar2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                        operator_delete(local_158._M_dataplus._M_p,
                                        local_158.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      CanonicalizePath(&local_138,(uint64_t *)&local_158);
                      path_01.str_._2_6_ = local_138._M_dataplus._M_p._2_6_;
                      path_01.str_._0_2_ = local_138._M_dataplus._M_p._0_2_;
                      path_01.len_ = local_138._M_string_length;
                      local_58.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)State::GetNode((this->super_Parser).state_,path_01,
                                                   (uint64_t)local_158._M_dataplus._M_p);
                      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                                ((vector<Node_*,_std::allocator<Node_*>_> *)local_40,
                                 (value_type *)&local_58);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                    local_138._M_dataplus._M_p._0_2_) != &local_138.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                               local_138._M_dataplus._M_p._0_2_),
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    if (sVar1 == 0) break;
                    this_00 = this_00 + 1;
                    local_f0 = (Lexer *)CONCAT71(local_f0._1_7_,
                                                 this_00 ==
                                                 local_78.
                                                 super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish);
                  } while (this_00 !=
                           local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
                }
                unaff_R14 = local_80;
                if (((ulong)local_f0 & 1) != 0) {
                  this_02 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_f8->_M_parent)->_M_t)._M_impl.super__Rb_tree_header.
                             _M_header._M_left;
                  std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                            ((vector<Node_*,_std::allocator<Node_*>_> *)this_02,
                             ((long)local_98.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_98.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555);
                  if (local_98.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_98.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    local_f8 = (_Base_ptr)&this->env_;
                    this_01 = local_98.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    unaff_R14 = local_80;
                    local_f0 = this_03;
                    do {
                      EvalString::Evaluate_abi_cxx11_
                                (&local_138,(EvalString *)this_01,(Env *)local_f8);
                      sVar1 = local_138._M_string_length;
                      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                      if (local_138._M_string_length == 0) {
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_158,"empty path","");
                        bVar2 = Lexer::Error(local_f0,&local_158,err);
                        unaff_R14 = (ulong)bVar2;
                      }
                      else {
                        local_158._M_string_length = 0;
                        local_158.field_2._M_allocated_capacity =
                             local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        CanonicalizePath(&local_138,(uint64_t *)&local_58);
                        path_02.str_._2_6_ = local_138._M_dataplus._M_p._2_6_;
                        path_02.str_._0_2_ = local_138._M_dataplus._M_p._0_2_;
                        path_02.len_ = local_138._M_string_length;
                        local_38 = State::GetNode((this->super_Parser).state_,path_02,
                                                  (uint64_t)
                                                  local_58.parsed_.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)this_02,&local_38);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_158._M_dataplus._M_p != &local_158.field_2) {
                        operator_delete(local_158._M_dataplus._M_p,
                                        local_158.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                      local_138._M_dataplus._M_p._0_2_) != &local_138.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                                 local_138._M_dataplus._M_p._0_2_),
                                        local_138.field_2._M_allocated_capacity + 1);
                      }
                      if (sVar1 == 0) goto LAB_001100cc;
                      this_01 = (pointer)((long)&(this_01->first).field_2 + 8);
                    } while (this_01 !=
                             local_98.parsed_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  unaff_R14 = 1;
                }
              }
              else {
                unaff_R14 = 0;
              }
            }
          }
LAB_001100cc:
          std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_78);
        }
      }
      else {
        paVar6 = &local_138.field_2;
        local_138._M_dataplus._M_p._0_2_ = SUB82(paVar6,0);
        local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar6 >> 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"expected build command name \'dyndep\'","");
        bVar2 = Lexer::Error(this_03,&local_138,err);
        unaff_R14 = (ulong)bVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) != paVar6
           ) {
          operator_delete((undefined1 *)
                          CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_
                                  ),local_138.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_e8 != (undefined1  [8])&local_d8) {
        operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
      }
    }
    else {
      unaff_R14 = 0;
    }
  }
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)&local_98);
LAB_0010f9e2:
  return (bool)((byte)unaff_R14 & 1);
}

Assistant:

bool DyndepParser::ParseEdge(string* err) {
  // Parse one explicit output.  We expect it to already have an edge.
  // We will record its dynamically-discovered dependency information.
  Dyndeps* dyndeps = NULL;
  {
    EvalString out0;
    if (!lexer_.ReadPath(&out0, err))
      return false;
    if (out0.empty())
      return lexer_.Error("expected path", err);

    string path = out0.Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* node = state_->LookupNode(path);
    if (!node || !node->in_edge())
      return lexer_.Error("no build statement exists for '" + path + "'", err);
    Edge* edge = node->in_edge();
    std::pair<DyndepFile::iterator, bool> res =
      dyndep_file_->insert(DyndepFile::value_type(edge, Dyndeps()));
    if (!res.second)
      return lexer_.Error("multiple statements for '" + path + "'", err);
    dyndeps = &res.first->second;
  }

  // Disallow explicit outputs.
  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    if (!out.empty())
      return lexer_.Error("explicit outputs not supported", err);
  }

  // Parse implicit outputs, if any.
  vector<EvalString> outs;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return err;
      if (out.empty())
        break;
      outs.push_back(out);
    }
  }

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name) || rule_name != "dyndep")
    return lexer_.Error("expected build command name 'dyndep'", err);

  // Disallow explicit inputs.
  {
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (!in.empty())
      return lexer_.Error("explicit inputs not supported", err);
  }

  // Parse implicit inputs, if any.
  vector<EvalString> ins;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return err;
      if (in.empty())
        break;
      ins.push_back(in);
    }
  }

  // Disallow order-only inputs.
  if (lexer_.PeekToken(Lexer::PIPE2))
    return lexer_.Error("order-only inputs not supported", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;
    if (key != "restat")
      return lexer_.Error("binding is not 'restat'", err);
    string value = val.Evaluate(&env_);
    dyndeps->restat_ = !value.empty();
  }

  dyndeps->implicit_inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* n = state_->GetNode(path, slash_bits);
    dyndeps->implicit_inputs_.push_back(n);
  }

  dyndeps->implicit_outputs_.reserve(outs.size());
  for (vector<EvalString>::iterator i = outs.begin(); i != outs.end(); ++i) {
    string path = i->Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    string path_err;
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* n = state_->GetNode(path, slash_bits);
    dyndeps->implicit_outputs_.push_back(n);
  }

  return true;
}